

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBase::FillCMakeVariablePath(cmFindBase *this)

{
  bool bVar1;
  mapped_type *this_00;
  string var;
  allocator local_61;
  string local_60;
  string local_40;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::CMake);
  std::__cxx11::string::string((string *)&local_40,"CMAKE_",(allocator *)&local_60);
  std::__cxx11::string::append((string *)&local_40);
  std::__cxx11::string::append((char *)&local_40);
  std::__cxx11::string::string((string *)&local_60,"CMAKE_PREFIX_PATH",&local_61);
  cmSearchPath::AddCMakePrefixPath(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  cmSearchPath::AddCMakePath(this_00,&local_40);
  bVar1 = std::operator==(&(this->super_cmFindCommon).CMakePathName,"PROGRAM");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_60,"CMAKE_APPBUNDLE_PATH",&local_61);
    cmSearchPath::AddCMakePath(this_00,&local_60);
  }
  else {
    std::__cxx11::string::string((string *)&local_60,"CMAKE_FRAMEWORK_PATH",&local_61);
    cmSearchPath::AddCMakePath(this_00,&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  cmSearchPath::AddSuffixes(this_00,&(this->super_cmFindCommon).SearchPathSuffixes);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmFindBase::FillCMakeVariablePath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMake];

  // Add CMake varibles of the same name as the previous environment
  // varibles CMAKE_*_PATH to be used most of the time with -D
  // command line options
  std::string var = "CMAKE_";
  var += this->CMakePathName;
  var += "_PATH";
  paths.AddCMakePrefixPath("CMAKE_PREFIX_PATH");
  paths.AddCMakePath(var);

  if (this->CMakePathName == "PROGRAM") {
    paths.AddCMakePath("CMAKE_APPBUNDLE_PATH");
  } else {
    paths.AddCMakePath("CMAKE_FRAMEWORK_PATH");
  }
  paths.AddSuffixes(this->SearchPathSuffixes);
}